

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneloader.h
# Opt level: O0

void json_parse_light<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (Scene *s,
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *c)

{
  bool bVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *c_00;
  PointLight *this;
  const_reference this_00;
  long in_RDI;
  char *in_stack_00000078;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_00000080;
  value_type *in_stack_ffffffffffffff58;
  vector<PointLight_*,_std::allocator<PointLight_*>_> *in_stack_ffffffffffffff60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff68;
  PointLight *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  const_reference in_stack_ffffffffffffff80;
  
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_00000080,in_stack_00000078);
  bVar1 = nlohmann::operator==<const_char_*,_0>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
  ;
  if (bVar1) {
    operator_new(0x18);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_00000080,in_stack_00000078);
    json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (in_stack_ffffffffffffff68);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_00000080,in_stack_00000078);
    json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (in_stack_ffffffffffffff68);
    PointLight::PointLight
              (in_stack_ffffffffffffff70,(Vector3f *)in_stack_ffffffffffffff68,
               (Vector3f *)in_stack_ffffffffffffff60);
    std::vector<PointLight_*,_std::allocator<PointLight_*>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_00000080,in_stack_00000078);
    bVar1 = nlohmann::operator==<const_char_*,_0>
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      c_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)(in_RDI + 0xb0);
      this = (PointLight *)operator_new(0x18);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_00000080,in_stack_00000078);
      json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (c_00);
      this_00 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>(in_stack_00000080,in_stack_00000078);
      json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (c_00);
      PointLight::PointLight(this,(Vector3f *)c_00,(Vector3f *)this_00);
      std::vector<PointLight_*,_std::allocator<PointLight_*>_>::push_back
                ((vector<PointLight_*,_std::allocator<PointLight_*>_> *)this_00,
                 in_stack_ffffffffffffff58);
    }
  }
  return;
}

Assistant:

void json_parse_light(Scene& s,const T& c)
{
	if(c["type"]=="PointLight")
		s.point_lights.push_back(new PointLight(json_to_v3(c["o"]), json_to_v3(c["c"])));
	else if(c["type"]=="PointLightDecay")
		s.point_lights_decay.push_back(new PointLight(json_to_v3(c["o"]), json_to_v3(c["c"])));
}